

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O2

string * __thiscall
LiteScript::_Type_ARRAY::ToString_abi_cxx11_
          (string *__return_storage_ptr__,_Type_ARRAY *this,Variable *object)

{
  Array *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  Object *pOVar4;
  ostream *poVar5;
  Type *this_01;
  char *pcVar6;
  ulong uVar7;
  uint idx;
  Variable v;
  stringstream ss;
  undefined1 local_1e8 [16];
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,"{");
  pOVar4 = Variable::operator->(object);
  this_00 = (Array *)pOVar4->data;
  uVar2 = Array::UnamedCount(this_00);
  for (uVar7 = 0; uVar2 != uVar7; uVar7 = uVar7 + 1) {
    iVar3 = Array::ExistUnamed(this_00,(uint)uVar7);
    if (iVar3 != 0) {
      poVar5 = std::operator<<(local_1a8,"[");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,"]:");
      Array::ConstantGet((Array *)local_1e8,(uint)this_00);
      Variable::operator_cast_to_string((string *)(local_1e8 + 0x10),(Variable *)local_1e8);
      std::operator<<(poVar5,local_1d8._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)(local_1e8 + 0x10));
      Variable::~Variable((Variable *)local_1e8);
      if (uVar7 < uVar2 - 1) {
        std::operator<<(local_1a8,",");
      }
    }
  }
  uVar2 = Array::UnamedCount(this_00);
  if (uVar2 != 0) {
    uVar2 = Array::NamedCount(this_00);
    if (uVar2 != 0) {
      std::operator<<(local_1a8,",");
    }
  }
  uVar2 = Array::NamedCount(this_00);
  for (idx = 0; uVar2 != idx; idx = idx + 1) {
    Array::GetNamedVariable((Array *)local_1e8,(uint)this_00);
    pOVar4 = Variable::operator->((Variable *)local_1e8);
    this_01 = Object::GetType(pOVar4);
    bVar1 = Type::operator!=(this_01,(Type *)_type_undefined);
    if (bVar1) {
      poVar5 = std::operator<<(local_1a8,"[\'");
      pcVar6 = Array::GetNamedKey(this_00,idx);
      poVar5 = std::operator<<(poVar5,pcVar6);
      poVar5 = std::operator<<(poVar5,"\']:");
      Variable::operator_cast_to_string((string *)(local_1e8 + 0x10),(Variable *)local_1e8);
      std::operator<<(poVar5,local_1d8._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)(local_1e8 + 0x10));
      if (idx < uVar2 - 1) {
        std::operator<<(local_1a8,",");
      }
    }
    Variable::~Variable((Variable *)local_1e8);
  }
  std::operator<<(local_1a8,"}");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string LiteScript::_Type_ARRAY::ToString(const Variable &object) const {
    std::stringstream ss;
    ss << "{";
    const Array& obj = object->GetData<Array>();
    for (unsigned int i = 0, sz = obj.UnamedCount(); i < sz; i++) {
        if (obj.ExistUnamed(i)) {
            ss << "[" << i << "]:" << ((std::string) (obj.ConstantGet(i))).c_str();
            if (i < sz - 1)
                ss << ",";
        }
    }
    if (obj.UnamedCount() > 0 && obj.NamedCount() > 0)
        ss << ",";
    for (unsigned int i = 0, sz = obj.NamedCount(); i < sz; i++) {
        Variable v = obj.GetNamedVariable(i);
        if (v->GetType() != Type::UNDEFINED) {
            ss << "['" << obj.GetNamedKey(i) << "']:" << ((std::string) (v)).c_str();
            if (i < sz - 1)
                ss << ",";
        }
    }
    ss << "}";
    return ss.str();
}